

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O0

void tr_fprint(FILE *file,TestResult *tr,print_output print_mode)

{
  char *__ptr;
  char *trstr;
  print_output print_mode_local;
  TestResult *tr_local;
  FILE *file_local;
  
  trstr._4_4_ = print_mode;
  if (print_mode == CK_ENV) {
    trstr._4_4_ = get_env_printmode();
  }
  if (((CK_NORMAL < trstr._4_4_) && (tr->rtype == CK_PASS)) ||
     ((tr->rtype != CK_PASS && (CK_MINIMAL < trstr._4_4_)))) {
    __ptr = tr_str(tr);
    fprintf((FILE *)file,"%s\n",__ptr);
    free(__ptr);
  }
  return;
}

Assistant:

void tr_fprint(FILE * file, TestResult * tr, enum print_output print_mode)
{
    if(print_mode == CK_ENV)
    {
        print_mode = get_env_printmode();
    }

    if((print_mode >= CK_VERBOSE && tr->rtype == CK_PASS) ||
       (tr->rtype != CK_PASS && print_mode >= CK_NORMAL))
    {
        char *trstr = tr_str(tr);

        fprintf(file, "%s\n", trstr);
        free(trstr);
    }
}